

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall
SynthWidget::SynthWidget
          (SynthWidget *this,Master *master,SynthRoute *useSynthRoute,bool pinnable,
          AudioDevice *useAudioDevice,QWidget *parent)

{
  QFrame *pQVar1;
  QIcon *pQVar2;
  QCheckBox *pQVar3;
  bool visible;
  SynthRouteState SynthRouteState;
  SynthWidget *pSVar4;
  SynthStateMonitor *this_00;
  QSettings *pQVar5;
  undefined7 in_register_00000009;
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QArrayDataPointer<char16_t> local_88;
  QVariant local_70;
  QVariant local_50;
  
  QWidget::QWidget(&this->super_QWidget,parent,0,CONCAT71(in_register_00000009,pinnable));
  *(undefined ***)this = &PTR_metaObject_001a88f8;
  *(undefined ***)&this->field_0x10 = &PTR__SynthWidget_001a8aa8;
  this->synthRoute = useSynthRoute;
  pSVar4 = (SynthWidget *)operator_new(400);
  this->ui = pSVar4;
  SynthPropertiesDialog::SynthPropertiesDialog
            ((SynthPropertiesDialog *)&this->spd,parent,useSynthRoute);
  AudioPropertiesDialog::AudioPropertiesDialog((AudioPropertiesDialog *)&this->apd,parent);
  MidiPropertiesDialog::MidiPropertiesDialog((MidiPropertiesDialog *)&this->mpd,parent);
  Ui_SynthWidget::setupUi(&this->ui->super_Ui_SynthWidget,&this->super_QWidget);
  setEmuModeText(this);
  this_00 = (SynthStateMonitor *)operator_new(0x1c8);
  SynthStateMonitor::SynthStateMonitor(this_00,this->ui,this->synthRoute);
  this->synthStateMonitor = this_00;
  pQVar5 = Master::getSettings(master);
  QString::QString((QString *)&local_88,"Master/showSynthDetails");
  QVariant::QVariant(&local_70,"0");
  QSettings::value((QString *)&local_50,(QVariant *)pQVar5);
  visible = (bool)QVariant::toBool();
  QVariant::~QVariant(&local_50);
  QVariant::~QVariant(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  pQVar1 = (this->ui->super_Ui_SynthWidget).detailsFrame;
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,visible);
  pQVar2 = (QIcon *)(this->ui->super_Ui_SynthWidget).detailsButton;
  getSynthDetailsIcon(visible);
  QAbstractButton::setIcon(pQVar2);
  refreshAudioDeviceList(this,master,useAudioDevice);
  pQVar3 = (this->ui->super_Ui_SynthWidget).pinCheckBox;
  Master::isPinned(master,this->synthRoute);
  QAbstractButton::setChecked(SUB81(pQVar3,0));
  QWidget::setEnabled(SUB81((this->ui->super_Ui_SynthWidget).pinCheckBox,0));
  Master::configureMidiPropertiesDialog(master,&this->mpd);
  updateMidiAddActionEnabled(this->ui);
  QObject::connect(local_90,(char *)this->synthRoute,(QObject *)"2stateChanged(SynthRouteState)",
                   (char *)this,0x17247a);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,(char *)this->synthRoute,(QObject *)"2midiSessionAdded(MidiSession *)",
                   (char *)this,0x1724c3);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,(char *)this->synthRoute,(QObject *)"2midiSessionRemoved(MidiSession *)"
                   ,(char *)this,0x17250d);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QObject::connect(local_a8,(char *)this->synthRoute,
                   (QObject *)"2midiSessionNameChanged(MidiSession *)",(char *)this,0x17255d);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,(char *)master,(QObject *)"2synthRoutePinned()",(char *)this,0x17258a);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QObject::connect(local_b8,(char *)(this->ui->super_Ui_SynthWidget).synthPropertiesButton,
                   (QObject *)"2clicked()",(char *)&this->spd,0x1725a4);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  SynthRoute::connectReportHandler
            (this->synthRoute,"2masterVolumeChanged(int)",(QObject *)this,
             "1handleMasterVolumeChanged(int)");
  SynthRouteState = SynthRoute::getState(this->synthRoute);
  handleSynthRouteState(this,SynthRouteState);
  return;
}

Assistant:

SynthWidget::SynthWidget(Master *master, SynthRoute *useSynthRoute, bool pinnable, const AudioDevice *useAudioDevice, QWidget *parent) :
	QWidget(parent),
	synthRoute(useSynthRoute),
	ui(new Ui::SynthWidget),
	spd(parent, useSynthRoute),
	apd(parent),
	mpd(parent)
{
	ui->setupUi(this);

	setEmuModeText();

	synthStateMonitor = new SynthStateMonitor(ui, synthRoute);

	bool detailsVisible = master->getSettings()->value("Master/showSynthDetails", "0").toBool();
	ui->detailsFrame->setVisible(detailsVisible);
	ui->detailsButton->setIcon(SynthWidget::getSynthDetailsIcon(detailsVisible));

	refreshAudioDeviceList(master, useAudioDevice);
	ui->pinCheckBox->setChecked(master->isPinned(synthRoute));
	ui->pinCheckBox->setEnabled(pinnable);

	master->configureMidiPropertiesDialog(mpd);
	updateMidiAddActionEnabled(ui);

	connect(synthRoute, SIGNAL(stateChanged(SynthRouteState)), SLOT(handleSynthRouteState(SynthRouteState)));
	connect(synthRoute, SIGNAL(midiSessionAdded(MidiSession *)), SLOT(handleMIDISessionAdded(MidiSession *)));
	connect(synthRoute, SIGNAL(midiSessionRemoved(MidiSession *)), SLOT(handleMIDISessionRemoved(MidiSession *)));
	connect(synthRoute, SIGNAL(midiSessionNameChanged(MidiSession *)), SLOT(handleMIDISessionNameChanged(MidiSession *)));
	connect(master, SIGNAL(synthRoutePinned()), SLOT(handleSynthRoutePinned()));
	connect(ui->synthPropertiesButton, SIGNAL(clicked()), &spd, SLOT(exec()));

	synthRoute->connectReportHandler(SIGNAL(masterVolumeChanged(int)), this, SLOT(handleMasterVolumeChanged(int)));

	handleSynthRouteState(synthRoute->getState());
}